

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_version.c
# Opt level: O3

void test_version(void)

{
  long lVar1;
  byte bVar2;
  wchar_t wVar3;
  ulong in_RAX;
  char *_v1;
  ulong uVar4;
  ushort **ppuVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  size_t sVar14;
  byte *_v1_00;
  ulong local_38;
  
  local_38 = in_RAX;
  wVar3 = systemf("%s --version >version.stdout 2>version.stderr",testprog);
  failure("Unable to run %s --version",testprog);
  wVar3 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                           ,L'(',(uint)(wVar3 == L'\0'),"r == 0",(void *)0x0);
  if (wVar3 == L'\0') {
    return;
  }
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
             ,L',',"version.stderr");
  _v1 = slurpfile(&local_38,"version.stdout");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                   ,L'0',(uint)(6 < local_38),"s > 6",(void *)0x0);
  failure("Version must start with \'bsdcat\': ``%s\'\'",_v1);
  wVar3 = assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                              ,L'2',_v1,"q","bsdcat ","\"bsdcat \"",7,"7",(void *)0x0);
  if (wVar3 == L'\0') {
    return;
  }
  pcVar10 = _v1 + 7;
  uVar6 = local_38 - 7;
  pcVar11 = pcVar10;
  if (uVar6 != 0) {
    pcVar7 = _v1 + local_38;
    uVar13 = local_38 - 8;
    local_38 = uVar6;
    do {
      uVar4 = uVar13;
      pcVar11 = pcVar10;
      uVar6 = local_38;
      if (*pcVar10 != '.' && 9 < (byte)(*pcVar10 - 0x30U)) break;
      pcVar10 = pcVar10 + 1;
      uVar13 = uVar4 - 1;
      pcVar11 = pcVar7;
      local_38 = uVar4;
      uVar6 = uVar4;
    } while (uVar4 != 0);
  }
  local_38 = uVar6;
  failure("No space after bsdcat version: ``%s\'\'",_v1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                   ,L'<',(uint)(1 < local_38),"s > 1",(void *)0x0);
  uVar13 = (ulong)((byte)(*pcVar11 + 0x9fU) < 4);
  failure("No space after bsdcat version: ``%s\'\'",_v1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                   ,L'A',(uint)(pcVar11[uVar13] == ' '),"*q == \' \'",(void *)0x0);
  local_38 = local_38 - 1;
  failure("No `-\' between bsdcat and libarchive versions: ``%s\'\'",_v1);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                      ,L'E',pcVar11 + uVar13 + 1,"q","- ","\"- \"",2,"2",(void *)0x0);
  local_38 = local_38 - 2;
  failure("Not long enough for libarchive version: ``%s\'\'",_v1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                   ,L'I',(uint)(0xb < local_38),"s > 11",(void *)0x0);
  failure("Libarchive version must start with `libarchive\': ``%s\'\'",_v1);
  wVar3 = L'\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                      ,L'K',pcVar11 + uVar13 + 3,"q","libarchive ","\"libarchive \"",0xb,"11",
                      (void *)0x0);
  uVar6 = local_38;
  pcVar7 = pcVar11 + uVar13 + 0xe;
  sVar8 = local_38 - 0xb;
  pcVar10 = pcVar7;
  if (sVar8 != 0) {
    pcVar10 = pcVar11 + uVar13 + local_38 + 3;
    lVar12 = 0;
    lVar9 = 0;
    local_38 = sVar8;
    do {
      if (pcVar7[lVar12] != '.' && 9 < (byte)(pcVar7[lVar12] - 0x30U)) {
        uVar13 = (ulong)((byte)(pcVar7[lVar12] + 0x9fU) < 4);
        _v1_00 = (byte *)(pcVar7 + (uVar13 - lVar9));
        sVar8 = (uVar6 + lVar9) - 0xc;
        goto LAB_001080a9;
      }
      local_38 = (uVar6 + lVar9) - 0xc;
      lVar12 = lVar12 + 1;
      lVar1 = uVar6 + lVar9;
      lVar9 = lVar9 + -1;
      sVar8 = local_38;
    } while (lVar1 != 0xc);
  }
  local_38 = sVar8;
  _v1_00 = (byte *)(pcVar10 + ((byte)(*pcVar10 + 0x9fU) < 4));
  goto LAB_001080e6;
  while( true ) {
    _v1_00 = _v1_00 + 1;
    sVar8 = sVar14 - 1;
    local_38 = sVar14;
    if (sVar14 == 0) break;
LAB_001080a9:
    sVar14 = sVar8;
    bVar2 = *_v1_00;
    if (((0x2f < (ulong)bVar2) || ((0xc00100000000U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) &&
       (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(char)bVar2] & 8) == 0)) {
      wVar3 = L'\x01';
      goto LAB_001080e6;
    }
  }
  wVar3 = L'\0';
  _v1_00 = (byte *)(pcVar7 + uVar6 + uVar13 + -0xb);
LAB_001080e6:
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                   ,L'[',wVar3,"s >= 1",(void *)0x0);
  failure("Version output must end with \\n or \\r\\n");
  if (*_v1_00 == 0xd) {
    _v1_00 = _v1_00 + 1;
    local_38 = local_38 - 1;
  }
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                      ,L'_',_v1_00,"q","\n","\"\\n\"",1,"1",(void *)0x0);
  free(_v1);
  return;
}

Assistant:

DEFINE_TEST(test_version)
{
	int r;
	char *p, *q;
	size_t s;


	r = systemf("%s --version >version.stdout 2>version.stderr", testprog);
	failure("Unable to run %s --version", testprog);
	if (!assert(r == 0))
		return;

	/* --version should generate nothing to stdout. */
	assertEmptyFile("version.stderr");
	/* Verify format of version message. */
	q = p = slurpfile(&s, "version.stdout");
	/* Version message should start with name of program, then space. */
	assert(s > 6);
	failure("Version must start with 'bsdcat': ``%s''", p);
	if (!assertEqualMem(q, "bsdcat ", 7))
		return;
	q += 7; s -= 7;
	/* Version number is a series of digits and periods. */
	while (s > 0 && (*q == '.' || (*q >= '0' && *q <= '9'))) {
		++q;
		--s;
	}
	/* Version number terminated by space. */
	failure("No space after bsdcat version: ``%s''", p);
	assert(s > 1);
	/* Skip a single trailing a,b,c, or d. */
	if (*q == 'a' || *q == 'b' || *q == 'c' || *q == 'd')
		++q;
	failure("No space after bsdcat version: ``%s''", p);
	assert(*q == ' ');
	++q; --s;
	/* Separator. */
	failure("No `-' between bsdcat and libarchive versions: ``%s''", p);
	assertEqualMem(q, "- ", 2);
	q += 2; s -= 2;
	/* libarchive name and version number */
	failure("Not long enough for libarchive version: ``%s''", p);
	assert(s > 11);
	failure("Libarchive version must start with `libarchive': ``%s''", p);
	assertEqualMem(q, "libarchive ", 11);
	q += 11; s -= 11;
	/* Version number is a series of digits and periods. */
	while (s > 0 && (*q == '.' || (*q >= '0' && *q <= '9'))) {
		++q;
		--s;
	}
	/* Skip a single trailing a,b,c, or d. */
	if (*q == 'a' || *q == 'b' || *q == 'c' || *q == 'd')
		++q;
	/* Skip arbitrary third-party version numbers. */
	while (s > 0 && (*q == ' ' || *q == '/' || *q == '.' || isalnum(*q))) {
		++q;
		--s;
	}
	/* All terminated by end-of-line. */
	assert(s >= 1);
	/* Skip an optional CR character (e.g., Windows) */
	failure("Version output must end with \\n or \\r\\n");
	if (*q == '\r') { ++q; --s; }
	assertEqualMem(q, "\n", 1);
	free(p);
}